

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso3.c
# Opt level: O3

void Gia_Iso3Init(Gia_Man_t *p)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  long lVar4;
  undefined4 uVar5;
  uint uVar6;
  
  uVar1 = p->nObjs;
  if ((0 < (int)uVar1) && (pGVar2 = p->pObjs, pGVar2 != (Gia_Obj_t *)0x0)) {
    lVar4 = 0;
    do {
      uVar3 = *(ulong *)(&pGVar2->field_0x0 + lVar4);
      uVar6 = (uint)uVar3;
      if ((uVar3 & 0x1fffffff) == 0x1fffffff || (int)uVar6 < 0) {
        uVar5 = 0xf2db64f8;
        if ((~uVar6 & 0x9fffffff) != 0) {
          uVar5 = 0xdebbdff0;
          if ((int)(uVar3 & 0x1fffffff) != 0x1fffffff) {
            uVar5 = 0xde3126bb;
          }
          if (-1 < (int)uVar6) {
            uVar5 = 0xdebbdff0;
          }
        }
      }
      else {
        uVar5 = *(undefined4 *)
                 ((long)Iso_Nodes +
                 (ulong)((((uint)(uVar3 >> 0x1d) & 1) + (uint)((uVar3 >> 0x3d & 1) != 0)) * 4));
      }
      *(undefined4 *)((long)&pGVar2->Value + lVar4) = uVar5;
      lVar4 = lVar4 + 0xc;
    } while ((ulong)uVar1 * 0xc != lVar4);
  }
  return;
}

Assistant:

void Gia_Iso3Init( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    Gia_ManForEachObj( p, pObj, i )
        pObj->Value = Gia_Iso3Node( pObj );
}